

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_clearall(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *co;
  long lVar2;
  
  if (cookies != (CookieInfo *)0x0) {
    lVar2 = 0;
    do {
      co = cookies->cookies[lVar2];
      while (co != (Cookie *)0x0) {
        pCVar1 = co->next;
        freecookie(co);
        co = pCVar1;
      }
      cookies->cookies[lVar2] = (Cookie *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    cookies->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *cookies)
{
  if(cookies) {
    unsigned int i;
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      Curl_cookie_freelist(cookies->cookies[i]);
      cookies->cookies[i] = NULL;
    }
    cookies->numcookies = 0;
  }
}